

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphMaker.cc
# Opt level: O1

void __thiscall
GraphMaker::new_graph_from_kmerlist_128
          (GraphMaker *this,vector<unsigned___int128,_std::allocator<unsigned___int128>_> *kmerlist,
          uint8_t k)

{
  ulong *puVar1;
  char *pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  SequenceDistanceGraph *pSVar4;
  undefined8 uVar5;
  uint uVar6;
  undefined1 kmer [16];
  undefined1 kmer_00 [16];
  undefined1 kmer_01 [16];
  undefined1 kmer_02 [16];
  undefined1 kmer_03 [16];
  undefined1 kmer_04 [16];
  undefined1 kmer_05 [16];
  undefined1 kmer_06 [16];
  undefined1 kmer_07 [16];
  undefined1 kmer_08 [16];
  undefined1 kmer_09 [16];
  undefined1 kmer_10 [16];
  undefined1 kmer_11 [16];
  undefined1 kmer_12 [16];
  undefined1 kmer_13 [16];
  undefined1 kmer_14 [16];
  unsigned___int128 uVar7;
  pointer ppVar8;
  uint uVar9;
  ostream *poVar10;
  pointer puVar11;
  __uint128_t *p_Var12;
  __uint128_t *p_Var13;
  ulong uVar14;
  pointer pNVar15;
  byte bVar16;
  int iVar17;
  difference_type __d_8;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  pointer pkVar21;
  pointer ppVar22;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  long lVar23;
  long lVar24;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong uVar25;
  long extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  difference_type __n;
  pointer puVar26;
  ulong uVar27;
  ulong uVar28;
  vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>> *this_00
  ;
  difference_type __d_11;
  pointer pkVar29;
  _Bit_type *p_Var30;
  ulong uVar31;
  byte bVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  pointer ppVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  string s;
  vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
  out;
  array<unsigned___int128,_4UL> bns;
  vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
  in;
  vector<bool,_std::allocator<bool>_> used_kmers;
  vector<bool,_std::allocator<bool>_> is_end_bw;
  vector<bool,_std::allocator<bool>_> is_end_fw;
  vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
  last;
  vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
  first;
  vector<kcontext,_std::allocator<kcontext>_> kcontextlist;
  CStringKMerFactory128 skf_ovl;
  uint in_stack_fffffffffffffae0;
  undefined4 uVar39;
  int in_stack_fffffffffffffae4;
  undefined4 uVar40;
  pointer local_510;
  undefined1 *local_4e0;
  long local_4d8;
  undefined1 local_4d0;
  undefined7 uStack_4cf;
  _Bit_type *local_4c0;
  long local_4b8;
  pointer local_4b0;
  unsigned_long local_4a8;
  ulong local_4a0;
  vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
  local_498;
  ulong local_480;
  undefined1 local_478 [16];
  __uint128_t *local_468 [2];
  __uint128_t *local_458;
  undefined8 local_450;
  __uint128_t *local_448;
  undefined8 local_440;
  vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
  local_438;
  ulong local_418;
  ulong local_410;
  vector<bool,_std::allocator<bool>_> local_408;
  vector<bool,_std::allocator<bool>_> local_3e0;
  vector<bool,_std::allocator<bool>_> local_3b8;
  ulong local_390;
  undefined1 local_388 [16];
  pointer local_378;
  undefined1 local_368 [16];
  pointer local_358;
  vector<kcontext,_std::allocator<kcontext>_> local_348;
  Node local_330;
  Node local_2f8;
  Node local_2c0;
  undefined1 local_288 [16];
  undefined1 auStack_278 [16];
  __uint128_t *p_Stack_268;
  undefined8 local_260;
  __uint128_t *local_258;
  ulong local_250;
  long local_248;
  long local_240;
  char local_238 [65];
  char local_1f7;
  char local_1f5;
  char local_1f1;
  char local_1e4;
  char local_1d7;
  char local_1d5;
  char local_1d1;
  char local_1c4;
  undefined1 local_138 [65];
  char local_f7;
  char local_f5;
  char local_f1;
  char local_e4;
  char local_d7;
  char local_d5;
  char local_d1;
  char local_c4;
  
  std::vector<Node,_std::allocator<Node>_>::_M_erase_at_end
            (&this->sg->nodes,
             (this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::
  vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  ::_M_erase_at_end(&(this->sg->super_DistanceGraph).links,
                    (this->sg->super_DistanceGraph).links.
                    super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->sg->oldnames,
                    (this->sg->oldnames).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pSVar4 = this->sg;
  local_288._0_8_ = auStack_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"");
  paVar3 = &local_2c0.sequence.field_2;
  local_2c0.sequence._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c0,local_288._0_8_,(pointer)(local_288._0_8_ + local_288._8_8_));
  local_2c0.status = Deleted;
  local_2c0.support.type = Undefined;
  local_2c0.support.index = 0;
  local_2c0.support.id = 0;
  SequenceDistanceGraph::add_node(pSVar4,&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0.sequence._M_dataplus._M_p != paVar3) {
    operator_delete(local_2c0.sequence._M_dataplus._M_p,
                    local_2c0.sequence.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_288._0_8_ != auStack_278) {
    operator_delete((void *)local_288._0_8_,auStack_278._0_8_ + 1);
  }
  poVar10 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Constructing Graph from ",0x18);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
  uVar6 = (uint)k;
  uVar33 = 3 - (k < 100);
  if (k < 10) {
    uVar33 = 1;
  }
  local_288._0_8_ = auStack_278;
  std::__cxx11::string::_M_construct((ulong)local_288,(char)uVar33);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_288._0_8_,uVar33,(uint)k);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,(char *)local_288._0_8_,local_288._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"-mers",5);
  std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  if ((undefined1 *)local_288._0_8_ != auStack_278) {
    operator_delete((void *)local_288._0_8_,auStack_278._0_8_ + 1);
  }
  local_4e0 = &local_4d0;
  local_4d8 = 0;
  local_4d0 = 0;
  std::__cxx11::string::reserve((ulong)&local_4e0);
  local_288._0_8_ = local_288._0_8_ & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_408,
             (long)(kmerlist->
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(kmerlist->
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 4,(bool *)local_288,
             (allocator_type *)local_478);
  std::vector<kcontext,_std::allocator<kcontext>_>::vector
            (&local_348,
             (long)(kmerlist->
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(kmerlist->
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)local_288);
  local_288._0_8_ = local_288._0_8_ & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_3b8,
             (long)(kmerlist->
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(kmerlist->
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 4,(bool *)local_288,
             (allocator_type *)local_478);
  local_288._0_8_ = local_288._0_8_ & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_3e0,
             (long)(kmerlist->
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(kmerlist->
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 4,(bool *)local_288,
             (allocator_type *)local_478);
  poVar10 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Finding neighbours",0x12);
  std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  puVar11 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar11) {
    bVar32 = k * '\x02';
    uVar35 = -1L << (bVar32 & 0x3f);
    uVar27 = 0;
    uVar25 = uVar35;
    uVar34 = -1L << (bVar32 & 0x3f) | 0xffffffffffffffffU >> 0x40 - (bVar32 & 0x3f);
    if ((bVar32 & 0x40) != 0) {
      uVar25 = uVar27;
      uVar34 = uVar35;
    }
    bVar32 = k * '\x02' - 2;
    do {
      pkVar21 = local_348.super__Vector_base<kcontext,_std::allocator<kcontext>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar7 = puVar11[uVar27];
      uVar35 = *(ulong *)((long)puVar11 + uVar27 * 0x10 + 8);
      uVar18 = (ulong)uVar7 * 4;
      uVar28 = 0;
      uVar20 = 0;
      do {
        *(ulong *)(local_288 + uVar20 * 0x10) = uVar18 + uVar20 & ~uVar25;
        *(ulong *)(local_288 + uVar20 * 0x10 + 8) =
             ((uVar35 & 0xfffffffffffffff) << 2 | (ulong)uVar7 >> 0x3e) + uVar28 +
             (ulong)CARRY8(uVar18,uVar20) & ~uVar34;
        bVar37 = uVar28 < (uVar20 < 3);
        uVar28 = uVar28 + (0xfffffffffffffffe < uVar20);
        uVar20 = uVar20 + 1;
      } while (bVar37);
      local_510 = local_348.super__Vector_base<kcontext,_std::allocator<kcontext>_>._M_impl.
                  super__Vector_impl_data._M_start;
      *(undefined1 *)
       (local_348.super__Vector_base<kcontext,_std::allocator<kcontext>_>._M_impl.
        super__Vector_impl_data._M_start + uVar27) = 0;
      kmer._8_4_ = in_stack_fffffffffffffae0;
      kmer._0_8_ = uVar27;
      kmer._12_4_ = in_stack_fffffffffffffae4;
      uVar35 = uVar27;
      p_Var12 = kmer_cannonical128((__uint128_t *)local_288._0_8_,(__uint128_t)kmer,local_288[8]);
      puVar11 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                )._M_impl.super__Vector_impl_data._M_start;
      puVar26 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      uVar28 = (long)puVar26 - (long)puVar11 >> 4;
      while (uVar20 = uVar28, 0 < (long)uVar20) {
        uVar28 = uVar20 >> 1;
        uVar18 = *(ulong *)((long)puVar11 + uVar28 * 0x10 + 8);
        if (uVar18 < extraout_RDX ||
            uVar18 - extraout_RDX < (ulong)(*(__uint128_t **)(puVar11 + uVar28) < p_Var12)) {
          puVar11 = puVar11 + uVar28 + 1;
          uVar28 = ~uVar28 + uVar20;
        }
      }
      if ((puVar11 != puVar26) &&
         (extraout_RDX == *(ulong *)((long)puVar11 + 8) && p_Var12 == *(__uint128_t **)puVar11)) {
        *(undefined1 *)(pkVar21 + uVar35) = 1;
      }
      kmer_00[8] = k;
      kmer_00._0_8_ = uVar35;
      kmer_00._9_3_ = 0;
      kmer_00._12_4_ = in_stack_fffffffffffffae4;
      in_stack_fffffffffffffae0 = (uint)k;
      p_Var12 = kmer_cannonical128((__uint128_t *)auStack_278._0_8_,(__uint128_t)kmer_00,
                                   auStack_278[8]);
      puVar11 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                )._M_impl.super__Vector_impl_data._M_start;
      puVar26 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      uVar28 = (long)puVar26 - (long)puVar11 >> 4;
      while (uVar20 = uVar28, 0 < (long)uVar20) {
        uVar28 = uVar20 >> 1;
        uVar18 = *(ulong *)((long)puVar11 + uVar28 * 0x10 + 8);
        if (uVar18 < extraout_RDX_00 ||
            uVar18 - extraout_RDX_00 < (ulong)(*(__uint128_t **)(puVar11 + uVar28) < p_Var12)) {
          puVar11 = puVar11 + uVar28 + 1;
          uVar28 = ~uVar28 + uVar20;
        }
      }
      if ((puVar11 != puVar26) &&
         (extraout_RDX_00 == *(ulong *)((long)puVar11 + 8) && p_Var12 == *(__uint128_t **)puVar11))
      {
        *(byte *)(pkVar21 + uVar35) = *(byte *)(pkVar21 + uVar35) | 2;
      }
      kmer_01._8_4_ = in_stack_fffffffffffffae0;
      kmer_01._0_8_ = uVar35;
      kmer_01._12_4_ = in_stack_fffffffffffffae4;
      p_Var12 = kmer_cannonical128(p_Stack_268,(__uint128_t)kmer_01,(uint8_t)local_260);
      puVar11 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                )._M_impl.super__Vector_impl_data._M_start;
      puVar26 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      uVar28 = (long)puVar26 - (long)puVar11 >> 4;
      while (uVar20 = uVar28, 0 < (long)uVar20) {
        uVar28 = uVar20 >> 1;
        uVar18 = *(ulong *)((long)puVar11 + uVar28 * 0x10 + 8);
        if (uVar18 < extraout_RDX_01 ||
            uVar18 - extraout_RDX_01 < (ulong)(*(__uint128_t **)(puVar11 + uVar28) < p_Var12)) {
          puVar11 = puVar11 + uVar28 + 1;
          uVar28 = ~uVar28 + uVar20;
        }
      }
      if ((puVar11 != puVar26) &&
         (extraout_RDX_01 == *(ulong *)((long)puVar11 + 8) && p_Var12 == *(__uint128_t **)puVar11))
      {
        *(byte *)(pkVar21 + uVar35) = *(byte *)(pkVar21 + uVar35) | 4;
      }
      kmer_02._8_4_ = in_stack_fffffffffffffae0;
      kmer_02._0_8_ = uVar35;
      kmer_02._12_4_ = in_stack_fffffffffffffae4;
      p_Var12 = kmer_cannonical128(local_258,(__uint128_t)kmer_02,(uint8_t)local_250);
      puVar11 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                )._M_impl.super__Vector_impl_data._M_start;
      puVar26 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      uVar28 = (long)puVar26 - (long)puVar11 >> 4;
      while (uVar20 = uVar28, 0 < (long)uVar20) {
        uVar28 = uVar20 >> 1;
        uVar18 = *(ulong *)((long)puVar11 + uVar28 * 0x10 + 8);
        if (uVar18 < extraout_RDX_02 ||
            uVar18 - extraout_RDX_02 < (ulong)(*(__uint128_t **)(puVar11 + uVar28) < p_Var12)) {
          puVar11 = puVar11 + uVar28 + 1;
          uVar28 = ~uVar28 + uVar20;
        }
      }
      if ((puVar11 != puVar26) &&
         (extraout_RDX_02 == *(ulong *)((long)puVar11 + 8) && p_Var12 == *(__uint128_t **)puVar11))
      {
        *(byte *)(pkVar21 + uVar35) = *(byte *)(pkVar21 + uVar35) | 8;
      }
      puVar11 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar28 = *(ulong *)((long)puVar11 + uVar27 * 0x10 + 8);
      uVar18 = (ulong)puVar11[uVar27] >> 2 | uVar28 << 0x3e;
      uVar27 = 0;
      uVar20 = 0;
      do {
        uVar31 = uVar20 << (bVar32 & 0x3f);
        bVar37 = (bVar32 & 0x40) != 0;
        uVar14 = uVar27 << (bVar32 & 0x3f) | uVar20 >> 0x40 - (bVar32 & 0x3f);
        if (bVar37) {
          uVar14 = uVar31;
        }
        uVar19 = 0;
        if (!bVar37) {
          uVar19 = uVar31;
        }
        *(ulong *)(local_478 + uVar20 * 0x10) = uVar19 + uVar18;
        *(ulong *)(local_478 + uVar20 * 0x10 + 8) =
             uVar14 + (uVar28 >> 2) + (ulong)CARRY8(uVar19,uVar18);
        bVar37 = uVar27 < (uVar20 < 3);
        uVar27 = uVar27 + (0xfffffffffffffffe < uVar20);
        uVar20 = uVar20 + 1;
      } while (bVar37);
      kmer_03._8_4_ = in_stack_fffffffffffffae0;
      kmer_03._0_8_ = uVar35;
      kmer_03._12_4_ = in_stack_fffffffffffffae4;
      p_Var12 = kmer_cannonical128((__uint128_t *)local_478._0_8_,(__uint128_t)kmer_03,local_478[8])
      ;
      puVar26 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      uVar27 = (long)puVar26 - (long)puVar11 >> 4;
      while (uVar28 = uVar27, 0 < (long)uVar28) {
        uVar27 = uVar28 >> 1;
        uVar20 = *(ulong *)((long)puVar11 + uVar27 * 0x10 + 8);
        if (uVar20 < extraout_RDX_03 ||
            uVar20 - extraout_RDX_03 < (ulong)(*(__uint128_t **)(puVar11 + uVar27) < p_Var12)) {
          puVar11 = puVar11 + uVar27 + 1;
          uVar27 = ~uVar27 + uVar28;
        }
      }
      if ((puVar11 != puVar26) &&
         (extraout_RDX_03 == *(ulong *)((long)puVar11 + 8) && p_Var12 == *(__uint128_t **)puVar11))
      {
        *(byte *)(pkVar21 + uVar35) = *(byte *)(pkVar21 + uVar35) | 0x10;
      }
      kmer_04._8_4_ = in_stack_fffffffffffffae0;
      kmer_04._0_8_ = uVar35;
      kmer_04._12_4_ = in_stack_fffffffffffffae4;
      uVar27 = uVar35;
      p_Var12 = kmer_cannonical128(local_468[0],(__uint128_t)kmer_04,(uint8_t)local_468[1]);
      puVar11 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                )._M_impl.super__Vector_impl_data._M_start;
      puVar26 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      uVar28 = (long)puVar26 - (long)puVar11 >> 4;
      while (uVar20 = uVar28, 0 < (long)uVar20) {
        uVar28 = uVar20 >> 1;
        uVar18 = *(ulong *)((long)puVar11 + uVar28 * 0x10 + 8);
        if (uVar18 < extraout_RDX_04 ||
            uVar18 - extraout_RDX_04 < (ulong)(*(__uint128_t **)(puVar11 + uVar28) < p_Var12)) {
          puVar11 = puVar11 + uVar28 + 1;
          uVar28 = ~uVar28 + uVar20;
        }
      }
      if ((puVar11 != puVar26) &&
         (extraout_RDX_04 == *(ulong *)((long)puVar11 + 8) && p_Var12 == *(__uint128_t **)puVar11))
      {
        *(byte *)(pkVar21 + uVar35) = *(byte *)(pkVar21 + uVar35) | 0x20;
      }
      kmer_05._8_4_ = in_stack_fffffffffffffae0;
      kmer_05._0_8_ = uVar27;
      kmer_05._12_4_ = in_stack_fffffffffffffae4;
      p_Var12 = kmer_cannonical128(local_458,(__uint128_t)kmer_05,(uint8_t)local_450);
      puVar11 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                )._M_impl.super__Vector_impl_data._M_start;
      puVar26 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      uVar28 = (long)puVar26 - (long)puVar11 >> 4;
      while (uVar20 = uVar28, 0 < (long)uVar20) {
        uVar28 = uVar20 >> 1;
        uVar18 = *(ulong *)((long)puVar11 + uVar28 * 0x10 + 8);
        if (uVar18 < extraout_RDX_05 ||
            uVar18 - extraout_RDX_05 < (ulong)(*(__uint128_t **)(puVar11 + uVar28) < p_Var12)) {
          puVar11 = puVar11 + uVar28 + 1;
          uVar28 = ~uVar28 + uVar20;
        }
      }
      if ((puVar11 != puVar26) &&
         (extraout_RDX_05 == *(ulong *)((long)puVar11 + 8) && p_Var12 == *(__uint128_t **)puVar11))
      {
        *(byte *)(pkVar21 + uVar35) = *(byte *)(pkVar21 + uVar35) | 0x40;
      }
      kmer_06._8_4_ = in_stack_fffffffffffffae0;
      kmer_06._0_8_ = uVar27;
      kmer_06._12_4_ = in_stack_fffffffffffffae4;
      p_Var12 = kmer_cannonical128(local_448,(__uint128_t)kmer_06,(uint8_t)local_440);
      puVar11 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                )._M_impl.super__Vector_impl_data._M_start;
      puVar26 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      uVar27 = (long)puVar26 - (long)puVar11 >> 4;
      while (uVar28 = uVar27, 0 < (long)uVar28) {
        uVar27 = uVar28 >> 1;
        uVar20 = *(ulong *)((long)puVar11 + uVar27 * 0x10 + 8);
        if (uVar20 < extraout_RDX_06 ||
            uVar20 - extraout_RDX_06 < (ulong)(*(__uint128_t **)(puVar11 + uVar27) < p_Var12)) {
          puVar11 = puVar11 + uVar27 + 1;
          uVar27 = ~uVar27 + uVar28;
        }
      }
      if ((puVar11 != puVar26) &&
         (extraout_RDX_06 == *(ulong *)((long)puVar11 + 8) && p_Var12 == *(__uint128_t **)puVar11))
      {
        *(byte *)(pkVar21 + uVar35) = *(byte *)(pkVar21 + uVar35) | 0x80;
      }
      uVar27 = uVar35 + 1;
      puVar11 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar27 < (ulong)((long)(kmerlist->
                                    super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar11 >> 4
                             ));
  }
  poVar10 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Marking ends",0xc);
  std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  p_Var30 = local_3b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p;
  pkVar21 = (pointer)(kmerlist->
                     super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                     _M_impl.super__Vector_impl_data._M_start;
  lVar23 = (long)(kmerlist->
                 super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pkVar21;
  if (lVar23 != 0) {
    lVar24 = lVar23 >> 4;
    bVar16 = (byte)(uVar6 * 2);
    bVar32 = bVar16 & 0x3f;
    uVar33 = uVar6 * 2 - 2;
    local_4c0 = local_3e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar35 = -1L << (bVar16 & 0x3f);
    uVar27 = 0;
    uVar25 = uVar35;
    uVar34 = -1L << bVar32 | 0xffffffffffffffffU >> 0x40 - bVar32;
    if ((uVar6 * 2 & 0x40) != 0) {
      uVar25 = uVar27;
      uVar34 = uVar35;
    }
    in_stack_fffffffffffffae0 = (uint)lVar24;
    in_stack_fffffffffffffae4 = (int)(lVar23 >> 0x24);
    local_480 = lVar24 + (ulong)(lVar24 == 0);
    local_4b0 = local_348.super__Vector_base<kcontext,_std::allocator<kcontext>_>._M_impl.
                super__Vector_impl_data._M_start;
    pkVar29 = local_348.super__Vector_base<kcontext,_std::allocator<kcontext>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      bVar32 = *(byte *)(pkVar29 + uVar27);
      iVar17 = (int)local_4a0;
      if ((bVar32 >> 4 < 9) && ((0x116U >> (uint)(bVar32 >> 4) & 1) != 0)) {
        iVar17 = 0;
        if (((bVar32 & 0x10) == 0) &&
           (((iVar17 = 1, (bVar32 & 0x20) == 0 && (iVar17 = 2, (bVar32 & 0x40) == 0)) &&
            (iVar17 = (int)local_4a0, (char)bVar32 < '\0')))) {
          iVar17 = 3;
        }
        uVar35 = *(ulong *)(pkVar21 + uVar27 * 4 + 2);
        uVar18 = *(ulong *)(pkVar21 + uVar27 * 4) >> 2 | uVar35 << 0x3e;
        uVar28 = 0;
        uVar20 = 0;
        do {
          bVar16 = (byte)uVar33;
          bVar32 = bVar16 & 0x3f;
          uVar31 = uVar20 << (bVar16 & 0x3f);
          bVar37 = (uVar33 & 0x40) != 0;
          uVar14 = uVar28 << bVar32 | uVar20 >> 0x40 - bVar32;
          if (bVar37) {
            uVar14 = uVar31;
          }
          uVar19 = 0;
          if (!bVar37) {
            uVar19 = uVar31;
          }
          *(ulong *)(local_288 + uVar20 * 0x10) = uVar19 + uVar18;
          *(ulong *)(local_288 + uVar20 * 0x10 + 8) =
               uVar14 + (uVar35 >> 2) + (ulong)CARRY8(uVar19,uVar18);
          bVar37 = uVar28 < (uVar20 < 3);
          uVar28 = uVar28 + (0xfffffffffffffffe < uVar20);
          uVar20 = uVar20 + 1;
        } while (bVar37);
        p_Var12 = *(__uint128_t **)(local_288 + (long)iVar17 * 0x10);
        uVar35 = *(ulong *)(local_288 + (long)iVar17 * 0x10 + 8);
        kmer_07._8_4_ = in_stack_fffffffffffffae0;
        kmer_07._0_8_ = uVar27;
        kmer_07._12_4_ = in_stack_fffffffffffffae4;
        p_Var13 = kmer_cannonical128(p_Var12,(__uint128_t)kmer_07,(uint8_t)uVar35);
        pkVar29 = pkVar21;
        if (0 < CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)) {
          uVar28 = CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0);
          do {
            uVar18 = uVar28 >> 1;
            uVar20 = uVar18;
            if (*(ulong *)(pkVar29 + uVar18 * 4 + 2) < extraout_RDX_07 ||
                *(ulong *)(pkVar29 + uVar18 * 4 + 2) - extraout_RDX_07 <
                (ulong)(*(__uint128_t **)(pkVar29 + uVar18 * 4) < p_Var13)) {
              uVar20 = ~uVar18 + uVar28;
              pkVar29 = pkVar29 + uVar18 * 4 + 4;
            }
            uVar28 = uVar20;
          } while (0 < (long)uVar20);
        }
        lVar23 = (long)pkVar29 - (long)pkVar21 >> 2;
        uVar28 = (ulong)p_Var12 ^ (ulong)p_Var13;
        uVar35 = uVar35 ^ extraout_RDX_07;
        pkVar29 = local_4b0;
        if (uVar28 == 0 && uVar35 == 0) {
          uVar9 = *(byte *)((long)local_4b0 + lVar23) & 0xf;
          if ((8 < uVar9) || ((0x116U >> uVar9 & 1) == 0)) {
            uVar20 = uVar27 + 0x3f;
            if (-1 < (long)uVar27) {
              uVar20 = uVar27;
            }
            local_4c0[((long)uVar20 >> 6) +
                      ((ulong)((uVar27 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
                 local_4c0[((long)uVar20 >> 6) +
                           ((ulong)((uVar27 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                 1L << ((byte)uVar27 & 0x3f);
          }
          if (uVar28 != 0 || uVar35 != 0) goto LAB_001c3d1d;
        }
        else {
LAB_001c3d1d:
          uVar9 = (uint)(*(byte *)((long)local_4b0 + lVar23) >> 4);
          if ((8 < uVar9) || ((0x116U >> uVar9 & 1) == 0)) goto LAB_001c3d8d;
        }
      }
      else {
LAB_001c3d8d:
        uVar35 = uVar27 + 0x3f;
        if (-1 < (long)uVar27) {
          uVar35 = uVar27;
        }
        local_4c0[((long)uVar35 >> 6) +
                  ((ulong)((uVar27 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
             local_4c0[((long)uVar35 >> 6) +
                       ((ulong)((uVar27 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
             1L << ((byte)uVar27 & 0x3f);
      }
      local_4a0 = CONCAT44(local_4a0._4_4_,iVar17);
      bVar32 = *(byte *)(pkVar29 + uVar27);
      iVar17 = (int)local_4b8;
      if (((bVar32 & 0xf) < 9) && ((0x116U >> (bVar32 & 0xf) & 1) != 0)) {
        iVar17 = 0;
        if (((bVar32 & 1) == 0) &&
           (((iVar17 = 1, (bVar32 & 2) == 0 && (iVar17 = 2, (bVar32 & 4) == 0)) &&
            (iVar17 = (int)local_4b8, (bVar32 & 8) != 0)))) {
          iVar17 = 3;
        }
        uVar35 = *(ulong *)(pkVar21 + uVar27 * 4);
        uVar28 = *(ulong *)(pkVar21 + uVar27 * 4 + 2);
        uVar14 = uVar35 * 4;
        uVar20 = 0;
        uVar18 = 0;
        do {
          *(ulong *)(local_288 + uVar18 * 0x10) = uVar14 + uVar18 & ~uVar25;
          *(ulong *)(local_288 + uVar18 * 0x10 + 8) =
               ((uVar28 & 0xfffffffffffffff) << 2 | uVar35 >> 0x3e) + uVar20 +
               (ulong)CARRY8(uVar14,uVar18) & ~uVar34;
          bVar37 = uVar20 < (uVar18 < 3);
          uVar20 = uVar20 + (0xfffffffffffffffe < uVar18);
          uVar18 = uVar18 + 1;
        } while (bVar37);
        p_Var12 = *(__uint128_t **)(local_288 + (long)iVar17 * 0x10);
        uVar35 = *(ulong *)(local_288 + (long)iVar17 * 0x10 + 8);
        kmer_08._8_4_ = in_stack_fffffffffffffae0;
        kmer_08._0_8_ = uVar27;
        kmer_08._12_4_ = in_stack_fffffffffffffae4;
        p_Var13 = kmer_cannonical128(p_Var12,(__uint128_t)kmer_08,(uint8_t)uVar35);
        pkVar29 = pkVar21;
        if (0 < CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)) {
          uVar28 = CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0);
          do {
            uVar18 = uVar28 >> 1;
            uVar20 = uVar18;
            if (*(ulong *)(pkVar29 + uVar18 * 4 + 2) < extraout_RDX_08 ||
                *(ulong *)(pkVar29 + uVar18 * 4 + 2) - extraout_RDX_08 <
                (ulong)(*(__uint128_t **)(pkVar29 + uVar18 * 4) < p_Var13)) {
              uVar20 = ~uVar18 + uVar28;
              pkVar29 = pkVar29 + uVar18 * 4 + 4;
            }
            uVar28 = uVar20;
          } while (0 < (long)uVar20);
        }
        lVar23 = (long)pkVar29 - (long)pkVar21 >> 2;
        uVar28 = (ulong)p_Var12 ^ (ulong)p_Var13;
        uVar35 = uVar35 ^ extraout_RDX_08;
        pkVar29 = local_4b0;
        if (uVar28 == 0 && uVar35 == 0) {
          uVar9 = (uint)(*(byte *)((long)local_4b0 + lVar23) >> 4);
          if ((8 < uVar9) || ((0x116U >> uVar9 & 1) == 0)) {
            uVar20 = uVar27 + 0x3f;
            if (-1 < (long)uVar27) {
              uVar20 = uVar27;
            }
            puVar1 = p_Var30 + ((long)uVar20 >> 6) +
                               ((ulong)((uVar27 & 0x800000000000003f) < 0x8000000000000001) - 1);
            *puVar1 = *puVar1 | 1L << ((byte)uVar27 & 0x3f);
          }
          if (uVar28 != 0 || uVar35 != 0) goto LAB_001c3f42;
        }
        else {
LAB_001c3f42:
          uVar9 = *(byte *)((long)local_4b0 + lVar23) & 0xf;
          if ((8 < uVar9) || ((0x116U >> uVar9 & 1) == 0)) goto LAB_001c3fad;
        }
      }
      else {
LAB_001c3fad:
        uVar35 = uVar27 + 0x3f;
        if (-1 < (long)uVar27) {
          uVar35 = uVar27;
        }
        puVar1 = p_Var30 + ((long)uVar35 >> 6) +
                           ((ulong)((uVar27 & 0x800000000000003f) < 0x8000000000000001) - 1);
        *puVar1 = *puVar1 | 1L << ((byte)uVar27 & 0x3f);
      }
      uVar27 = uVar27 + 1;
      local_4b8 = CONCAT44(local_4b8._4_4_,iVar17);
      local_510 = pkVar21;
    } while (uVar27 != local_480);
  }
  poVar10 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Creating unitigs",0x10);
  std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  puVar11 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar11) {
    bVar16 = (byte)(uVar6 * 2);
    bVar32 = bVar16 & 0x3f;
    uVar25 = -1L << (bVar16 & 0x3f);
    local_390 = uVar25;
    uVar34 = -1L << bVar32 | 0xffffffffffffffffU >> 0x40 - bVar32;
    if ((uVar6 * 2 & 0x40) != 0) {
      local_390 = 0;
      uVar34 = uVar25;
    }
    uVar34 = ~uVar34;
    local_390 = ~local_390;
    local_480 = 0x800000000000003f;
    uVar25 = 0;
    local_410 = uVar34;
    do {
      uVar27 = uVar25 + 0x3f;
      if (-1 < (long)uVar25) {
        uVar27 = uVar25;
      }
      lVar23 = (long)uVar27 >> 6;
      uVar27 = (ulong)((uVar25 & local_480) < 0x8000000000000001);
      uVar35 = 1L << ((byte)uVar25 & 0x3f);
      if ((local_408.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[lVar23 + (uVar27 - 1)] >> (uVar25 & 0x3f) & 1) ==
          0) {
        lVar24 = uVar27 * 8 + -8;
        pkVar21 = *(pointer *)(puVar11 + uVar25);
        uVar28 = *(ulong *)((long)puVar11 + uVar25 * 0x10 + 8);
        p_Var30 = local_3b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar23;
        if ((local_3e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[lVar23 + (uVar27 - 1)] & uVar35) == 0) {
          if ((p_Var30[uVar27 - 1] & uVar35) != 0) {
            if ((local_3e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [lVar23 + (uVar27 - 1)] & uVar35) != 0) goto LAB_001c4154;
            goto LAB_001c41c8;
          }
        }
        else {
LAB_001c4154:
          if ((p_Var30[uVar27 - 1] & uVar35) == 0) {
LAB_001c41c8:
            local_408.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[lVar23 + (uVar27 - 1)] =
                 local_408.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [lVar23 + (uVar27 - 1)] | uVar35;
            uVar20 = p_Var30[uVar27 - 1];
            local_418 = ~uVar35;
            if ((uVar20 & uVar35) == 0) {
              in_stack_fffffffffffffae0 = (uint)uVar28;
              in_stack_fffffffffffffae4 = (int)(uVar28 >> 0x20);
            }
            else {
              if (k == '\0') {
                pkVar29 = (pointer)0x0;
                in_stack_fffffffffffffae0 = 0;
                in_stack_fffffffffffffae4 = 0;
              }
              else {
                pkVar29 = (pointer)0x0;
                uVar18 = 0;
                uVar33 = uVar6;
                do {
                  uVar9 = (uint)pkVar21;
                  pkVar21 = (pointer)((ulong)pkVar21 >> 2 | uVar28 << 0x3e);
                  uVar14 = uVar18 << 2;
                  uVar18 = uVar14 | (ulong)pkVar29 >> 0x3e;
                  uVar28 = uVar28 >> 2;
                  pkVar29 = (pointer)((ulong)(uVar9 & 3) + (long)pkVar29 * 4 ^ 3);
                  uVar33 = uVar33 - 1;
                } while (uVar33 != 0);
                in_stack_fffffffffffffae0 = (uint)uVar18;
                in_stack_fffffffffffffae4 = (int)(uVar14 >> 0x20);
              }
              uVar28 = uVar20 & local_418;
              if ((local_3e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [lVar23 + (uVar27 - 1)] & uVar35) != 0) {
                uVar28 = uVar20 | uVar35;
              }
              p_Var30[uVar27 - 1] = uVar28;
              local_3e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[lVar23 + (uVar27 - 1)] =
                   local_3e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [lVar23 + (uVar27 - 1)] | uVar35;
              pkVar21 = pkVar29;
            }
            kmer_10._8_4_ = in_stack_fffffffffffffae0;
            kmer_10._0_8_ = lVar24;
            kmer_10._12_4_ = in_stack_fffffffffffffae4;
            local_4c0 = p_Var30;
            kmer_to_sequence128_abi_cxx11_
                      ((string *)local_288,(__uint128_t)kmer_10,(uint8_t)pkVar21);
            std::__cxx11::string::operator=((string *)&local_4e0,(string *)local_288);
            uVar27 = uVar25;
            if ((undefined1 *)local_288._0_8_ != auStack_278) {
              operator_delete((void *)local_288._0_8_,auStack_278._0_8_ + 1);
            }
            do {
              if ((*(ulong *)((long)local_4c0 + lVar24) & uVar35) != 0) break;
              bVar32 = *(byte *)(local_348.super__Vector_base<kcontext,_std::allocator<kcontext>_>.
                                 _M_impl.super__Vector_impl_data._M_start + uVar27);
              lVar23 = CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0);
              kmer_11._8_4_ = in_stack_fffffffffffffae0;
              kmer_11._0_8_ = lVar24;
              kmer_11._12_4_ = in_stack_fffffffffffffae4;
              pkVar29 = (pointer)kmer_cannonical128((__uint128_t *)pkVar21,(__uint128_t)kmer_11,
                                                    (uint8_t)in_stack_fffffffffffffae0);
              if (pkVar29 == pkVar21 && extraout_RDX_09 == lVar23) {
                uVar33 = 0;
                if ((((bVar32 & 1) == 0) && (uVar33 = 1, (bVar32 & 2) == 0)) &&
                   ((uVar33 = 2, (bVar32 & 4) == 0 && (uVar33 = (uint)local_510, (bVar32 & 8) != 0))
                   )) {
                  uVar33 = 3;
                }
              }
              else {
                uVar33 = 3;
                if (((((bVar32 & 0x10) == 0) && (uVar33 = 2, (bVar32 & 0x20) == 0)) &&
                    (uVar33 = 1, (bVar32 & 0x40) == 0)) &&
                   (uVar33 = (uint)local_510, (char)bVar32 < '\0')) {
                  uVar33 = 0;
                }
              }
              uVar27 = 0;
              uVar28 = 0;
              do {
                *(ulong *)(local_288 + uVar28 * 0x10) = (long)pkVar21 * 4 + uVar28 & local_390;
                *(ulong *)(local_288 + uVar28 * 0x10 + 8) =
                     (CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0) << 2 |
                     (ulong)pkVar21 >> 0x3e) + uVar27 + (ulong)CARRY8((long)pkVar21 * 4,uVar28) &
                     uVar34;
                bVar37 = uVar27 < (uVar28 < 3);
                uVar27 = uVar27 + (0xfffffffffffffffe < uVar28);
                uVar28 = uVar28 + 1;
              } while (bVar37);
              local_4b0 = *(pointer *)(local_288 + (long)(int)uVar33 * 0x10);
              uVar5 = *(undefined8 *)(local_288 + (long)(int)uVar33 * 0x10 + 8);
              kmer_12._8_4_ = in_stack_fffffffffffffae0;
              kmer_12._0_8_ = lVar24;
              kmer_12._12_4_ = in_stack_fffffffffffffae4;
              pkVar29 = (pointer)kmer_cannonical128((__uint128_t *)local_4b0,(__uint128_t)kmer_12,
                                                    (uint8_t)uVar5);
              pkVar21 = local_4b0;
              puVar11 = (kmerlist->
                        super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              puVar26 = puVar11;
              uVar34 = (long)(kmerlist->
                             super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)puVar11 >> 4;
              while (uVar27 = uVar34, 0 < (long)uVar27) {
                uVar34 = uVar27 >> 1;
                uVar28 = *(ulong *)((long)puVar26 + uVar34 * 0x10 + 8);
                if (uVar28 < extraout_RDX_10 ||
                    uVar28 - extraout_RDX_10 < (ulong)(*(pointer *)(puVar26 + uVar34) < pkVar29)) {
                  puVar26 = puVar26 + uVar34 + 1;
                  uVar34 = ~uVar34 + uVar27;
                }
              }
              in_stack_fffffffffffffae0 = (uint)uVar5;
              in_stack_fffffffffffffae4 = (int)((ulong)uVar5 >> 0x20);
              local_510 = (pointer)(ulong)uVar33;
              uVar27 = (long)puVar26 - (long)puVar11 >> 4;
              uVar34 = uVar27 + 0x3f;
              if (-1 < (long)uVar27) {
                uVar34 = uVar27;
              }
              lVar23 = (long)uVar34 >> 6;
              uVar20 = (ulong)((uVar27 & local_480) < 0x8000000000000001);
              uVar18 = 1L << ((byte)uVar27 & 0x3f);
              uVar28 = local_408.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [lVar23 + (uVar20 - 1)];
              uVar34 = local_410;
              if ((uVar28 >> (uVar27 & 0x3f) & 1) != 0) break;
              local_4b8 = uVar20 * 8 + -8;
              local_408.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[lVar23 + (uVar20 - 1)] = uVar18 | uVar28;
              local_4a0 = uVar28;
              std::__cxx11::string::push_back((char)&local_4e0);
              p_Var30 = local_3e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              if (extraout_RDX_10 == CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)
                  && pkVar29 == pkVar21) {
                p_Var30 = local_3b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              }
              if ((*(ulong *)((long)p_Var30 + local_4b8 + lVar23 * 8) & uVar18) == 0) {
                uVar34 = *(ulong *)((long)local_4c0 + lVar24) & local_418;
              }
              else {
                uVar34 = *(ulong *)((long)local_4c0 + lVar24) | uVar35;
              }
              *(ulong *)((long)local_4c0 + lVar24) = uVar34;
              uVar34 = local_410;
            } while ((local_4a0 & uVar18) == 0);
          }
          else {
            kmer_09._8_4_ = in_stack_fffffffffffffae0;
            kmer_09._0_8_ = lVar24;
            kmer_09._12_4_ = in_stack_fffffffffffffae4;
            kmer_to_sequence128_abi_cxx11_
                      ((string *)local_288,(__uint128_t)kmer_09,(uint8_t)pkVar21);
            std::__cxx11::string::operator=((string *)&local_4e0,(string *)local_288);
            if ((undefined1 *)local_288._0_8_ != auStack_278) {
              operator_delete((void *)local_288._0_8_,auStack_278._0_8_ + 1);
            }
            puVar1 = (ulong *)((long)local_408.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                              + lVar24 + lVar23 * 8);
            *puVar1 = *puVar1 | uVar35;
          }
          pSVar4 = this->sg;
          local_2f8.sequence._M_dataplus._M_p = (pointer)&local_2f8.sequence.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2f8,local_4e0,local_4e0 + local_4d8);
          local_2f8.status = Active;
          local_2f8.support.type = Undefined;
          local_2f8.support.index = 0;
          local_2f8.support.id = 0;
          SequenceDistanceGraph::add_node(pSVar4,&local_2f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8.sequence._M_dataplus._M_p != &local_2f8.sequence.field_2) {
            operator_delete(local_2f8.sequence._M_dataplus._M_p,
                            local_2f8.sequence.field_2._M_allocated_capacity + 1);
          }
          bVar37 = Node::is_canonical((this->sg->nodes).
                                      super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                      super__Vector_impl_data._M_finish + -1);
          if (!bVar37) {
            Node::make_rc((this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                          super__Vector_impl_data._M_finish + -1);
          }
        }
      }
      uVar25 = uVar25 + 1;
      puVar11 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar25 < (ulong)((long)(kmerlist->
                                    super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar11 >> 4
                             ));
  }
  poVar10 = sdglib::OutputLog(INFO,true);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," unitigs",8);
  std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  poVar10 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"doing the circles now",0x15);
  std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  puVar11 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar11) {
    bVar16 = (byte)(uVar6 * 2);
    bVar32 = bVar16 & 0x3f;
    uVar27 = -1L << (bVar16 & 0x3f);
    uVar25 = uVar27;
    uVar34 = -1L << bVar32 | 0xffffffffffffffffU >> 0x40 - bVar32;
    if ((uVar6 * 2 & 0x40) != 0) {
      uVar25 = 0;
      uVar34 = uVar27;
    }
    pkVar21 = (pointer)0x0;
    do {
      pkVar29 = (pointer)((long)pkVar21 + 0x3f);
      if (-1 < (long)pkVar21) {
        pkVar29 = pkVar21;
      }
      uVar27 = (ulong)(((ulong)pkVar21 & 0x800000000000003f) < 0x8000000000000001);
      if ((local_408.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[((long)pkVar29 >> 6) + (uVar27 - 1)] >>
           ((ulong)pkVar21 & 0x3f) & 1) == 0) {
        uVar5 = (undefined8)puVar11[(long)pkVar21];
        uVar35 = *(ulong *)((long)puVar11 + (long)pkVar21 * 0x10 + 8);
        local_478 = (undefined1  [16])0x0;
        local_468[0] = (__uint128_t *)0x0;
        local_408.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[((long)pkVar29 >> 6) + (uVar27 - 1)] =
             local_408.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[((long)pkVar29 >> 6) + (uVar27 - 1)] |
             1L << ((byte)pkVar21 & 0x3f);
        uVar39 = (undefined4)uVar5;
        uVar40 = (undefined4)((ulong)uVar5 >> 0x20);
        kmer_13._8_4_ = uVar39;
        kmer_13._0_8_ = uVar35;
        kmer_13._12_4_ = uVar40;
        local_4b0 = pkVar21;
        kmer_to_sequence128_abi_cxx11_((string *)local_288,(__uint128_t)kmer_13,(uint8_t)uVar5);
        std::__cxx11::string::operator=((string *)&local_4e0,(string *)local_288);
        if ((undefined1 *)local_288._0_8_ != auStack_278) {
          operator_delete((void *)local_288._0_8_,auStack_278._0_8_ + 1);
        }
        uVar27 = CONCAT44(uVar40,uVar39);
        uVar28 = uVar35;
        while( true ) {
          if (local_478._8_8_ != local_478._0_8_) {
            local_478._8_8_ = local_478._0_8_;
          }
          uVar20 = 0;
          uVar18 = 0;
          do {
            *(ulong *)(local_288 + uVar18 * 0x10) = uVar27 * 4 + uVar18 & ~uVar25;
            *(ulong *)(local_288 + uVar18 * 0x10 + 8) =
                 (uVar35 << 2 | uVar27 >> 0x3e) + uVar20 + (ulong)CARRY8(uVar27 * 4,uVar18) &
                 ~uVar34;
            bVar37 = uVar20 < (uVar18 < 3);
            uVar20 = uVar20 + (0xfffffffffffffffe < uVar18);
            uVar18 = uVar18 + 1;
          } while (bVar37);
          lVar23 = 0;
          do {
            kmer_14._8_4_ = uVar39;
            kmer_14._0_8_ = uVar28;
            kmer_14._12_4_ = uVar40;
            p_Var12 = kmer_cannonical128(*(__uint128_t **)(local_288 + lVar23),(__uint128_t)kmer_14,
                                         (uint8_t)*(undefined8 *)(local_288 + lVar23 + 8));
            puVar11 = (kmerlist->
                      super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            puVar26 = puVar11;
            uVar27 = (long)(kmerlist->
                           super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)puVar11 >> 4;
            while (uVar35 = uVar27, 0 < (long)uVar35) {
              uVar27 = uVar35 >> 1;
              uVar20 = *(ulong *)((long)puVar26 + (uVar27 * 2 + 1) * 8);
              if (uVar20 < extraout_RDX_11 ||
                  uVar20 - extraout_RDX_11 < (ulong)(*(__uint128_t **)(puVar26 + uVar27) < p_Var12))
              {
                puVar26 = puVar26 + uVar27 + 1;
                uVar27 = ~uVar27 + uVar35;
              }
            }
            if (extraout_RDX_11 == *(ulong *)((long)puVar26 + 8) &&
                p_Var12 == *(__uint128_t **)puVar26) {
              local_438.
              super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((long)puVar26 - (long)puVar11 >> 4);
              std::vector<klidxs128,std::allocator<klidxs128>>::
              emplace_back<unsigned__int128_const&,long>
                        ((vector<klidxs128,std::allocator<klidxs128>> *)local_478,
                         (unsigned___int128 *)(local_288 + lVar23),(long *)&local_438);
            }
            lVar23 = lVar23 + 0x10;
          } while (lVar23 != 0x40);
          uVar27 = *(ulong *)local_478._0_8_;
          uVar35 = *(ulong *)(local_478._0_8_ + 8);
          if (uVar27 == CONCAT44(uVar40,uVar39) && uVar35 == uVar28) break;
          uVar20 = *(ulong *)(local_478._0_8_ + 0x10);
          uVar18 = uVar20 + 0x3f;
          if (-1 < (long)uVar20) {
            uVar18 = uVar20;
          }
          local_408.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p
          [((long)uVar18 >> 6) + ((ulong)((uVar20 & 0x800000000000003f) < 0x8000000000000001) - 1)]
               = local_408.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [((long)uVar18 >> 6) +
                  ((ulong)((uVar20 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                 1L << ((byte)uVar20 & 0x3f);
          std::__cxx11::string::push_back((char)&local_4e0);
        }
        pSVar4 = this->sg;
        local_330.sequence._M_dataplus._M_p = (pointer)&local_330.sequence.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_330,local_4e0,local_4e0 + local_4d8);
        local_330.status = Active;
        local_330.support.type = Undefined;
        local_330.support.index = 0;
        local_330.support.id = 0;
        SequenceDistanceGraph::add_node(pSVar4,&local_330);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330.sequence._M_dataplus._M_p != &local_330.sequence.field_2) {
          operator_delete(local_330.sequence._M_dataplus._M_p,
                          local_330.sequence.field_2._M_allocated_capacity + 1);
        }
        bVar37 = Node::is_canonical((this->sg->nodes).
                                    super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                    super__Vector_impl_data._M_finish + -1);
        if (!bVar37) {
          Node::make_rc((this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                        super__Vector_impl_data._M_finish + -1);
        }
        pkVar21 = local_4b0;
        if ((void *)local_478._0_8_ != (void *)0x0) {
          operator_delete((void *)local_478._0_8_,(long)local_468[0] - local_478._0_8_);
          pkVar21 = local_4b0;
        }
      }
      pkVar21 = (pointer)((long)pkVar21 + 1);
      puVar11 = (kmerlist->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (pkVar21 < (pointer)((long)(kmerlist->
                                       super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)puVar11
                                >> 4));
  }
  poVar10 = sdglib::OutputLog(INFO,true);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," unitigs",8);
  std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  local_438.
  super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_438.
  super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_438.
  super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_498.
  super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_498.
  super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_498.
  super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>::
  reserve(&local_438,
          ((long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x2492492492492492);
  std::
  vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>::
  reserve(&local_498,
          ((long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x2492492492492492);
  uVar33 = uVar6 * 2 - 2;
  bVar16 = (byte)uVar33;
  bVar32 = bVar16 & 0x3f;
  uVar25 = -1L << (bVar16 & 0x3f);
  local_288[0] = (char)(uVar6 - 1);
  uVar34 = uVar25;
  local_250 = -1L << bVar32 | 0xffffffffffffffffU >> 0x40 - bVar32;
  if ((uVar33 & 0x40) != 0) {
    uVar34 = 0;
    local_250 = uVar25;
  }
  local_250 = ~local_250;
  local_258 = (__uint128_t *)~uVar34;
  stack0xfffffffffffffd80 = (undefined1  [16])0x0;
  stack0xfffffffffffffd90 = (undefined1  [16])0x0;
  local_260 = 0;
  uVar34 = (ulong)((uVar6 - 1 & 0xff) * 2);
  local_248 = uVar34 - 2;
  local_240 = (ulong)(1 < uVar34) - 1;
  memset(local_238,0,0x100);
  local_238[0] = '\x04';
  memset(local_138,0,0x100);
  memset(local_238,4,0xff);
  memset(local_138,4,0xff);
  local_1f7 = '\0';
  local_1d7 = '\0';
  local_1f5 = '\x01';
  local_1d5 = '\x01';
  local_1f1 = '\x02';
  local_1d1 = '\x02';
  local_1e4 = '\x03';
  local_1c4 = '\x03';
  local_f7 = '\x03';
  local_d7 = '\x03';
  local_f5 = '\x02';
  local_d5 = '\x02';
  local_f1 = '\x01';
  local_d1 = '\x01';
  local_e4 = '\0';
  local_c4 = '\0';
  local_4a8 = 1;
  pNVar15 = (this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (1 < (ulong)(((long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pNVar15 >> 3) *
                 0x6db6db6db6db6db7)) {
    do {
      local_368 = (undefined1  [16])0x0;
      local_358 = (pointer)0x0;
      local_378 = (pointer)0x0;
      local_388 = (undefined1  [16])0x0;
      std::__cxx11::string::substr((ulong)local_478,(ulong)(pNVar15 + local_4a8));
      CStringKMerFactory128::create_kmers_direction
                ((CStringKMerFactory128 *)local_288,
                 (vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
                  *)local_368,(char *)local_478._0_8_);
      if ((__uint128_t **)local_478._0_8_ != local_468) {
        operator_delete((void *)local_478._0_8_,(long)local_468[0] + 1);
      }
      this_00 = (vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>
                 *)&local_438;
      if (*(bool *)(local_368._0_8_ + 0x10) != false) {
        this_00 = (vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>
                   *)&local_498;
      }
      std::vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>
      ::emplace_back<unsigned__int128&,unsigned_long&>
                (this_00,(unsigned___int128 *)local_368._0_8_,&local_4a8);
      std::__cxx11::string::substr
                ((ulong)local_478,
                 (ulong)((this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                         super__Vector_impl_data._M_start + local_4a8));
      CStringKMerFactory128::create_kmers_direction
                ((CStringKMerFactory128 *)local_288,
                 (vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
                  *)local_388,(char *)local_478._0_8_);
      if ((__uint128_t **)local_478._0_8_ != local_468) {
        operator_delete((void *)local_478._0_8_,(long)local_468[0] + 1);
      }
      if (*(bool *)(local_388._0_8_ + 0x10) == true) {
        local_478._0_8_ = -local_4a8;
        std::
        vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>::
        emplace_back<unsigned__int128&,unsigned_long>
                  ((vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>
                    *)&local_438,(unsigned___int128 *)local_388._0_8_,(unsigned_long *)local_478);
      }
      else {
        local_478._0_8_ = -local_4a8;
        std::
        vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>::
        emplace_back<unsigned__int128&,unsigned_long>
                  ((vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>
                    *)&local_498,(unsigned___int128 *)local_388._0_8_,(unsigned_long *)local_478);
      }
      if ((pointer)local_388._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_388._0_8_,(long)local_378 - local_388._0_8_);
      }
      if ((pointer)local_368._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_368._0_8_,(long)local_358 - local_368._0_8_);
      }
      local_4a8 = local_4a8 + 1;
      pNVar15 = (this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (local_4a8 <
             (ulong)(((long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pNVar15 >> 3) *
                    0x6db6db6db6db6db7));
  }
  ppVar8 = local_438.
           super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar36 = local_438.
            super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_438.
      super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_438.
      super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar34 = (long)local_438.
                   super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_438.
                   super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    lVar23 = 0x3f;
    if (uVar34 != 0) {
      for (; uVar34 >> lVar23 == 0; lVar23 = lVar23 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned__int128,long>*,std::vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_438.
               super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_438.
               super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar23 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned__int128,long>*,std::vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar8,ppVar36);
  }
  ppVar8 = local_498.
           super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar36 = local_498.
            super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_498.
      super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_498.
      super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar34 = (long)local_498.
                   super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_498.
                   super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    lVar23 = 0x3f;
    if (uVar34 != 0) {
      for (; uVar34 >> lVar23 == 0; lVar23 = lVar23 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned__int128,long>*,std::vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_498.
               super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_498.
               super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar23 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned__int128,long>*,std::vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar8,ppVar36);
  }
  ppVar8 = local_438.
           super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_438.
      super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_438.
      super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar34 = 0;
    ppVar36 = local_438.
              super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar27 = (long)local_498.
                     super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_498.
                     super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      uVar25 = uVar34;
      if (uVar34 < uVar27) {
        uVar35 = *(ulong *)((long)&ppVar36->first + 8);
        ppVar22 = local_498.
                  super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar34;
        do {
          uVar28 = *(ulong *)((long)&ppVar22->first + 8);
          uVar25 = uVar34;
          if (uVar35 <= uVar28 &&
              (ulong)((ulong)ppVar22->first < (ulong)ppVar36->first) <= uVar28 - uVar35) break;
          uVar34 = uVar34 + 1;
          ppVar22 = ppVar22 + 1;
          uVar25 = uVar27;
        } while (uVar27 != uVar34);
      }
      if (uVar25 < (ulong)((long)local_498.
                                 super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_498.
                                 super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        uVar27 = uVar25 << 5 | 0x10;
        uVar34 = uVar25;
        do {
          pcVar2 = (char *)((long)local_498.
                                  super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + (uVar27 - 0x10));
          auVar38[0] = -(*pcVar2 == (char)ppVar36->first);
          auVar38[1] = -(pcVar2[1] == *(char *)((long)&ppVar36->first + 1));
          auVar38[2] = -(pcVar2[2] == *(char *)((long)&ppVar36->first + 2));
          auVar38[3] = -(pcVar2[3] == *(char *)((long)&ppVar36->first + 3));
          auVar38[4] = -(pcVar2[4] == *(char *)((long)&ppVar36->first + 4));
          auVar38[5] = -(pcVar2[5] == *(char *)((long)&ppVar36->first + 5));
          auVar38[6] = -(pcVar2[6] == *(char *)((long)&ppVar36->first + 6));
          auVar38[7] = -(pcVar2[7] == *(char *)((long)&ppVar36->first + 7));
          auVar38[8] = -(pcVar2[8] == *(char *)((long)&ppVar36->first + 8));
          auVar38[9] = -(pcVar2[9] == *(char *)((long)&ppVar36->first + 9));
          auVar38[10] = -(pcVar2[10] == *(char *)((long)&ppVar36->first + 10));
          auVar38[0xb] = -(pcVar2[0xb] == *(char *)((long)&ppVar36->first + 0xb));
          auVar38[0xc] = -(pcVar2[0xc] == *(char *)((long)&ppVar36->first + 0xc));
          auVar38[0xd] = -(pcVar2[0xd] == *(char *)((long)&ppVar36->first + 0xd));
          auVar38[0xe] = -(pcVar2[0xe] == *(char *)((long)&ppVar36->first + 0xe));
          auVar38[0xf] = -(pcVar2[0xf] == *(char *)((long)&ppVar36->first + 0xf));
          if ((ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar38[0xf] >> 7) << 0xf) != 0xffff) break;
          DistanceGraph::add_link
                    (&this->sg->super_DistanceGraph,ppVar36->second,
                     *(sgNodeID_t *)
                      ((long)&(local_498.
                               super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->first + uVar27),1 - uVar6
                     ,(Support)ZEXT816(0));
          uVar34 = uVar34 + 1;
          uVar27 = uVar27 + 0x20;
        } while (uVar34 < (ulong)((long)local_498.
                                        super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_498.
                                        super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      ppVar36 = ppVar36 + 1;
      uVar34 = uVar25;
    } while (ppVar36 != ppVar8);
  }
  poVar10 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Graph construction finished",0x1b);
  std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  if (local_498.
      super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_498.
                    super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_498.
                          super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_498.
                          super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_438.
      super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_438.
                    super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_438.
                          super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_438.
                          super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_3e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_3e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_3e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_3e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_3e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_3e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_3e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_3e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_3b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_3b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_3b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_3b8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_3b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_3b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_3b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_3b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_3b8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_348.super__Vector_base<kcontext,_std::allocator<kcontext>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_348.super__Vector_base<kcontext,_std::allocator<kcontext>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_348.super__Vector_base<kcontext,_std::allocator<kcontext>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_348.super__Vector_base<kcontext,_std::allocator<kcontext>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_408.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_408.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_408.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_408.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_408.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_408.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_408.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_408.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_408.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_4e0 != &local_4d0) {
    operator_delete(local_4e0,CONCAT71(uStack_4cf,local_4d0) + 1);
  }
  return;
}

Assistant:

void GraphMaker::new_graph_from_kmerlist_128(const std::vector<__uint128_t> & kmerlist,uint8_t k) {
    //TODO: add a bloom filter to speed this up
    sg.nodes.clear();
    sg.links.clear();
    sg.oldnames.clear();
    sg.add_node(Node("",NodeStatus::Deleted));
    sdglib::OutputLog()<<"Constructing Graph from "<<kmerlist.size()<<" "<<std::to_string(k)<<"-mers"<<std::endl;
    std::string s;
    s.reserve(1000000); //avoid contig-sequence growth
    std::vector<bool> used_kmers(kmerlist.size());
    std::vector<kcontext> kcontextlist(kmerlist.size());
    std::vector<bool> is_end_fw(kmerlist.size());
    std::vector<bool> is_end_bw(kmerlist.size());
    sdglib::OutputLog()<<"Finding neighbours"<<std::endl;
#pragma omp parallel for
    for (uint64_t i=0;i<kmerlist.size();++i){
        auto fns=kmer_fw_neighbours128(kmerlist[i], k);
        auto &c=kcontextlist[i];
        c.fb.fw=0;
        c.fb.bw=0;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(fns[0],k))) c.sbcont.fA=1;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(fns[1],k))) c.sbcont.fC=1;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(fns[2],k))) c.sbcont.fG=1;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(fns[3],k))) c.sbcont.fT=1;
        auto bns=kmer_bw_neighbours128(kmerlist[i], k);
        if (in_sorted_vector(kmerlist,kmer_cannonical128(bns[0],k))) c.sbcont.bA=1;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(bns[1],k))) c.sbcont.bC=1;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(bns[2],k))) c.sbcont.bG=1;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(bns[3],k))) c.sbcont.bT=1;
    }
    sdglib::OutputLog()<<"Marking ends"<<std::endl;
#pragma omp parallel for
    for (uint64_t i=0;i<kmerlist.size();++i) {
        auto &c=kcontextlist[i];
        if (c.fb.bw!=1 and c.fb.bw!=2 and c.fb.bw!=4 and c.fb.bw!=8 ) {
            is_end_bw[i]=true;
        } else {
            int nn;
            if (c.sbcont.bA) nn=0;
            else if (c.sbcont.bC) nn=1;
            else if (c.sbcont.bG) nn=2;
            else if (c.sbcont.bT) nn=3;
            auto next=kmer_bw_neighbours128(kmerlist[i],k)[nn];
            auto cnext=kmer_cannonical128(next,k);
            auto ni=std::lower_bound(kmerlist.begin(),kmerlist.end(),cnext)-kmerlist.begin();
            auto &nc=kcontextlist[ni];
            if (next==cnext and nc.fb.fw!=1 and nc.fb.fw!=2 and nc.fb.fw!=4 and nc.fb.fw!=8) is_end_bw[i]=true;
            if (next!=cnext and nc.fb.bw!=1 and nc.fb.bw!=2 and nc.fb.bw!=4 and nc.fb.bw!=8) is_end_bw[i]=true;
        }
        if (c.fb.fw!=1 and c.fb.fw!=2 and c.fb.fw!=4 and c.fb.fw!=8 ) {
            is_end_fw[i]=true;
        } else {
            int nn;
            if (c.sbcont.fA) nn=0;
            else if (c.sbcont.fC) nn=1;
            else if (c.sbcont.fG) nn=2;
            else if (c.sbcont.fT) nn=3;
            auto next=kmer_fw_neighbours128(kmerlist[i],k)[nn];
            auto cnext=kmer_cannonical128(next,k);
            auto ni=std::lower_bound(kmerlist.begin(),kmerlist.end(),cnext)-kmerlist.begin();
            auto &nc=kcontextlist[ni];
            if (next==cnext and nc.fb.bw!=1 and nc.fb.bw!=2 and nc.fb.bw!=4 and nc.fb.bw!=8) is_end_fw[i]=true;
            if (next!=cnext and nc.fb.fw!=1 and nc.fb.fw!=2 and nc.fb.fw!=4 and nc.fb.fw!=8) is_end_fw[i]=true;
        }
    }
    sdglib::OutputLog()<<"Creating unitigs"<<std::endl;

    for (uint64_t start_kmer_idx=0;start_kmer_idx<kmerlist.size();++start_kmer_idx) {
        if (used_kmers[start_kmer_idx]) continue; //any kmer can only belong to one unitig.ww

        //Check this k-mer is an end/junction
        auto start_kmer = kmerlist[start_kmer_idx];


        auto end_bw=is_end_bw[start_kmer_idx];
        auto end_fw=is_end_fw[start_kmer_idx];

        if (!end_bw and !end_fw) continue;

        if (end_bw and end_fw) {
            //kmer as unitig
            s=kmer_to_sequence128(start_kmer, k);
            used_kmers[start_kmer_idx] = true;
        } else {
            //unitig start on kmer
            //make sure the unitig starts on FW

            auto current_kmer = start_kmer;
            auto current_idx = start_kmer_idx;
            used_kmers[start_kmer_idx] = true;

            if (end_fw) {
                current_kmer = kmer_reverse128(start_kmer, k);
                std::swap(end_fw,end_bw);
            }

            //Add kmer as unitig
            s=kmer_to_sequence128(current_kmer, k);

            unsigned char nucleotides[4] = {'A', 'C', 'G', 'T'};



            //std::cout<<"Starting sequence construction at kmer "<<kmer_to_sequence128(current_kmer,k)<<std::endl;
            while (!end_fw) {
                //Add end nucleotide, update current_kmer;
                //get_fw_idxs128(fwn, current_kmer, k, kmerlist);
                auto c=kcontextlist[current_idx];
                int nn;
                if (kmer_cannonical128(current_kmer,k)==current_kmer) {
                    if (c.sbcont.fA) nn = 0;
                    else if (c.sbcont.fC) nn = 1;
                    else if (c.sbcont.fG) nn = 2;
                    else if (c.sbcont.fT) nn = 3;
                }
                else{
                    if (c.sbcont.bA) nn = 3;
                    else if (c.sbcont.bC) nn = 2;
                    else if (c.sbcont.bG) nn = 1;
                    else if (c.sbcont.bT) nn = 0;
                }
                current_kmer=kmer_fw_neighbours128(current_kmer,k)[nn];
                auto ccurr=kmer_cannonical128(current_kmer,k);
                current_idx=std::lower_bound(kmerlist.begin(),kmerlist.end(),ccurr)-kmerlist.begin();
                if (used_kmers[current_idx]) break; //this should never happen, since these have ends.
                used_kmers[current_idx]=true;
                s.push_back(nucleotides[current_kmer % 4]);
                if (ccurr==current_kmer) end_fw = is_end_fw[current_idx];
                else end_fw = is_end_bw[current_idx];
            }
        }
        sg.add_node(Node(s));
        if (!sg.nodes.back().is_canonical()) sg.nodes.back().make_rc();//inefficient, but once in a node
    }
    sdglib::OutputLog()<<sg.nodes.size()<<" unitigs"<<std::endl;
    //If there are any perfect circles, they won't have ends, so just pick any unused kmer and go fw till you find the same k-mer fw.
    //(this is going to be even tricker to parallelise)
    sdglib::OutputLog()<<"doing the circles now"<<std::endl;
    for (uint64_t start_kmer_idx=0;start_kmer_idx<kmerlist.size();++start_kmer_idx) {
        if (used_kmers[start_kmer_idx]) continue; //any kmer can only belong to one unitig.ww

        //Check this k-mer is an end/junction
        auto start_kmer = kmerlist[start_kmer_idx];
        std::vector<klidxs128> fwn;
        unsigned char nucleotides[4] = {'A', 'C', 'G', 'T'};
        auto current_kmer = start_kmer;
        used_kmers[start_kmer_idx] = true;
        s=kmer_to_sequence128(current_kmer, k);

        while (true) {
            //Add end nucleotide, update current_kmer;
            get_fw_idxs128(fwn, current_kmer, k, kmerlist);
            current_kmer = fwn[0].kmer;
            if (current_kmer==start_kmer) break;
            used_kmers[fwn[0].idx] = true;
            s.push_back(nucleotides[current_kmer % 4]);
        }
        sg.add_node(Node(s));
        if (!sg.nodes.back().is_canonical()) sg.nodes.back().make_rc();//inefficient, but once in a node
    }
    sdglib::OutputLog()<<sg.nodes.size()<<" unitigs"<<std::endl;

    //save the (k-1)mer in (rev on first k-1 / fw on last k-1) or out ( fw on first k-1 / bw on last k-1)
    std::vector<std::pair<__uint128_t,sgNodeID_t>> in, out;
    in.reserve(2*sg.nodes.size());
    out.reserve(2*sg.nodes.size());
    CStringKMerFactory128 skf_ovl(k-1);
    for (uint64_t nid=1;nid<sg.nodes.size();++nid){
        std::vector<std::pair<__uint128_t,bool>> first,last;
        skf_ovl.create_kmers_direction(first,sg.nodes[nid].sequence.substr(0,k-1).c_str());
        if (first[0].second) out.emplace_back(first[0].first,nid);
        else in.emplace_back(first[0].first,nid);
        skf_ovl.create_kmers_direction(last,sg.nodes[nid].sequence.substr(sg.nodes[nid].sequence.size()-k+1,k-1).c_str());
        if (last[0].second) in.emplace_back(last[0].first,-nid);
        else out.emplace_back(last[0].first,-nid);
    }
    std::sort(in.begin(),in.end());
    std::sort(out.begin(),out.end());
    //connect out->in for all combinations on each kmer
    uint64_t next_out_idx=0;
    for(auto &i:in){
        while(next_out_idx<out.size() and out[next_out_idx].first<i.first) ++next_out_idx;
        for (auto oidx=next_out_idx;oidx<out.size() and out[oidx].first==i.first;++oidx) {
            sg.add_link(i.second,out[oidx].second,-k+1); //no support, although we could add the DBG operation as such
        }
    }
    sdglib::OutputLog()<<"Graph construction finished"<<std::endl;
}